

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_artifact_act(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *act_name;
  object_kind *poVar3;
  activation *paVar4;
  
  pvVar2 = parser_priv(p);
  act_name = parser_getstr(p,"name");
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    poVar3 = lookup_kind(*(wchar_t *)((long)pvVar2 + 0x20),*(wchar_t *)((long)pvVar2 + 0x24));
    if ((*(int *)((long)pvVar2 + 0x20) == 0x13) && ((uint)z_info->ordinary_kind_max <= poVar3->kidx)
       ) {
      paVar4 = findact(act_name);
      poVar3->activation = paVar4;
    }
    else {
      paVar4 = findact(act_name);
      *(activation **)((long)pvVar2 + 0x120) = paVar4;
    }
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_artifact_act(struct parser *p) {
	struct artifact *a = parser_priv(p);
	struct object_kind *k;
	const char *name = parser_getstr(p, "name");

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* Special light activations are a property of the base object */
	k = lookup_kind(a->tval, a->sval);
	if ((a->tval == TV_LIGHT) && (k->kidx >= z_info->ordinary_kind_max)) {
		k->activation = findact(name);
	} else {
		a->activation = findact(name);
	}
	return PARSE_ERROR_NONE;
}